

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O3

bool __thiscall FScanner::GetNumber(FScanner *this)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  char *in_RAX;
  long lVar3;
  char *stopper;
  char *local_28;
  
  local_28 = in_RAX;
  if (this->ScriptOpen == false) {
    I_FatalError("SC_ call before SC_Open().");
  }
  bVar1 = ScanString(this,false);
  if (bVar1) {
    __s1 = this->String;
    iVar2 = strcmp(__s1,"MAXINT");
    if (iVar2 == 0) {
      this->Number = 0x7fffffff;
      iVar2 = 0x7fffffff;
    }
    else {
      lVar3 = strtol(__s1,&local_28,0);
      iVar2 = (int)lVar3;
      this->Number = iVar2;
      if (*local_28 != '\0') {
        ScriptError(this,"SC_GetNumber: Bad numeric constant \"%s\".",this->String);
        iVar2 = this->Number;
      }
    }
    this->Float = (double)iVar2;
  }
  return bVar1;
}

Assistant:

bool FScanner::GetNumber ()
{
	char *stopper;

	CheckOpen();
	if (GetString())
	{
		if (strcmp (String, "MAXINT") == 0)
		{
			Number = INT_MAX;
		}
		else
		{
			Number = strtol (String, &stopper, 0);
			if (*stopper != 0)
			{
				ScriptError ("SC_GetNumber: Bad numeric constant \"%s\".", String);
			}
		}
		Float = Number;
		return true;
	}
	else
	{
		return false;
	}
}